

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O3

void freeobj(lua_State *L,GCObject *o)

{
  GCObject *pGVar1;
  lu_byte *osize;
  long lVar2;
  TString *ts;
  
  switch(o->tt) {
  case '\x04':
    luaS_remove(L,(TString *)o);
    pGVar1 = (GCObject *)(ulong)(byte)o->field_0xb;
    goto LAB_0010cdb4;
  case '\x05':
    luaH_free(L,(Table *)o);
    return;
  case '\x06':
    osize = (lu_byte *)((ulong)(byte)o->field_0xa * 8 + 0x20);
    break;
  case '\a':
    lVar2 = 0x20;
    if (*(ushort *)&o->field_0xa != 0) {
      lVar2 = (ulong)*(ushort *)&o->field_0xa * 0x10 + 0x28;
    }
    osize = (lu_byte *)((long)&(o[1].next)->next + lVar2);
    break;
  case '\b':
    luaE_freethread(L,(lua_State *)o);
    return;
  case '\t':
    if (o[1].next != (GCObject *)&o[1].tt) {
      luaF_unlinkupval((UpVal *)o);
    }
    osize = (lu_byte *)0x28;
    break;
  case '\n':
    luaF_freeproto(L,(Proto *)o);
    return;
  case '\v':
  case '\f':
  case '\r':
  case '\x0e':
  case '\x0f':
  case '\x10':
  case '\x11':
  case '\x12':
  case '\x13':
    return;
  case '\x14':
    pGVar1 = o[1].next;
LAB_0010cdb4:
    osize = &pGVar1[1].marked;
    break;
  default:
    if (o->tt != '&') {
      return;
    }
    osize = (lu_byte *)((ulong)(byte)o->field_0xa * 0x10 + 0x20);
  }
  luaM_free_(L,o,(size_t)osize);
  return;
}

Assistant:

static void freeobj (lua_State *L, GCObject *o) {
  switch (o->tt) {
    case LUA_VPROTO:
      luaF_freeproto(L, gco2p(o));
      break;
    case LUA_VUPVAL:
      freeupval(L, gco2upv(o));
      break;
    case LUA_VLCL: {
      LClosure *cl = gco2lcl(o);
      luaM_freemem(L, cl, sizeLclosure(cl->nupvalues));
      break;
    }
    case LUA_VCCL: {
      CClosure *cl = gco2ccl(o);
      luaM_freemem(L, cl, sizeCclosure(cl->nupvalues));
      break;
    }
    case LUA_VTABLE:
      luaH_free(L, gco2t(o));
      break;
    case LUA_VTHREAD:
      luaE_freethread(L, gco2th(o));
      break;
    case LUA_VUSERDATA: {
      Udata *u = gco2u(o);
      luaM_freemem(L, o, sizeudata(u->nuvalue, u->len));
      break;
    }
    case LUA_VSHRSTR: {
      TString *ts = gco2ts(o);
      luaS_remove(L, ts);  /* remove it from hash table */
      luaM_freemem(L, ts, sizelstring(ts->shrlen));
      break;
    }
    case LUA_VLNGSTR: {
      TString *ts = gco2ts(o);
      luaM_freemem(L, ts, sizelstring(ts->u.lnglen));
      break;
    }
    default: lua_assert(0);
  }
}